

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean mh2ad(Integer memhandle,AD **adout,BlockLocation location,char *caller)

{
  Pointer pcVar1;
  Boolean BVar2;
  AD *pAVar3;
  byte bVar4;
  char *pcVar5;
  _AD *p_Var6;
  _AD *p_Var7;
  char *__format;
  
  bVar4 = (byte)location & 0xf;
  BVar2 = ma_table_verify(memhandle,caller);
  if (BVar2 == 0) {
    return 0;
  }
  pAVar3 = (AD *)ma_table_lookup(memhandle);
  if ((pAVar3 < ma_segment) || (ma_eos <= pAVar3)) {
    __format = "invalid block address (0x%lx) for memhandle %ld";
    pcVar5 = (char *)memhandle;
    goto LAB_00162c7f;
  }
  pcVar1 = pAVar3->client_space;
  if (pcVar1 + pAVar3->nbytes + pAVar3->nelem + pAVar3->datatype == (Pointer)pAVar3->checksum) {
    if ((*(int *)(pcVar1 + -4) == -0x55555556) &&
       (*(int *)(pcVar1 + pAVar3->nelem * (long)ma_sizeof[pAVar3->datatype]) == 0x55555555)) {
      p_Var6 = ma_hused;
      if ((0xdU >> bVar4 & 1) == 0) {
        for (; p_Var6 != (AD *)0x0; p_Var6 = p_Var6->next) {
          if (p_Var6 == pAVar3) goto LAB_00162c1d;
        }
        __format = "memhandle %ld (name: \'%s\') not in heap";
      }
      else {
        p_Var6 = ma_sused;
        if ((0xbU >> bVar4 & 1) == 0) {
          for (; p_Var6 != (AD *)0x0; p_Var6 = p_Var6->next) {
            if (p_Var6 == pAVar3) goto LAB_00162c1d;
          }
        }
        else {
          if ((7U >> bVar4 & 1) != 0) {
            p_Var6 = ma_hused;
            if ((0xeU >> bVar4 & 1) != 0) {
LAB_00162c1d:
              *adout = pAVar3;
              return 1;
            }
            for (; p_Var7 = ma_sused, p_Var6 != (AD *)0x0; p_Var6 = p_Var6->next) {
              if (p_Var6 == pAVar3) goto LAB_00162c1d;
            }
            for (; p_Var7 != (AD *)0x0; p_Var7 = p_Var7->next) {
              if (p_Var7 == pAVar3) goto LAB_00162c1d;
            }
            __format = "memhandle %ld (name: \'%s\') not in heap or stack";
            goto LAB_00162c73;
          }
          for (; p_Var6 != (AD *)0x0; p_Var6 = p_Var6->next) {
            if (p_Var6 == pAVar3) {
              if (pAVar3 == (AD *)ma_sp) goto LAB_00162c1d;
              __format = "memhandle %ld (name: \'%s\') not top of stack";
              goto LAB_00162c73;
            }
          }
        }
        __format = "memhandle %ld (name: \'%s\') not in stack";
      }
    }
    else {
      __format = "invalid guard(s) for memhandle %ld (name: \'%s\')";
    }
  }
  else {
    __format = "invalid checksum for memhandle %ld (name: \'%s\')";
  }
LAB_00162c73:
  pcVar5 = pAVar3->name;
  pAVar3 = (AD *)memhandle;
LAB_00162c7f:
  sprintf(ma_ebuf,__format,pAVar3,pcVar5);
  ma_error(EL_Nonfatal,ET_External,caller,ma_ebuf);
  return 0;
}

Assistant:

private Boolean mh2ad(memhandle, adout, location, caller)
    Integer    memhandle;    /* the handle to verify and convert */
    AD        **adout;    /* RETURN: AD corresponding to memhandle */
    BlockLocation location;    /* where AD must reside */
    char    *caller;    /* name of calling routine */
{
    AD        *ad;
    Boolean    check_checksum = MA_TRUE;
    Boolean    check_guards = MA_TRUE;
    Boolean    check_heap = MA_FALSE;
    Boolean    check_stack = MA_FALSE;
    Boolean    check_stacktop = MA_FALSE;
    Boolean    check_heapandstack = MA_FALSE;

    switch (location)
    {
        case BL_HeapOrStack:
            check_heapandstack = MA_TRUE;
            break;
        case BL_Heap:
            check_heap = MA_TRUE;
            break;
        case BL_Stack:
            check_stack = MA_TRUE;
            break;
        case BL_StackTop:
            check_stacktop = MA_TRUE;
            break;
        default:
            (void)sprintf(ma_ebuf,
                "invalid location: %d",
                (int)location);
            ma_error(EL_Nonfatal, ET_Internal, "mh2ad", ma_ebuf);
            return MA_FALSE;
    }

    /* convert memhandle to AD */
    if (!ma_table_verify(memhandle, caller))
        return MA_FALSE;
    else
        ad = (AD *)ma_table_lookup(memhandle);

    /* attempt to avoid crashes due to corrupt addresses */
    if (!reasonable_address((Pointer)ad))
    {
        (void)sprintf(ma_ebuf,
            "invalid block address (0x%lx) for memhandle %ld",
            (size_t)ad, (size_t)memhandle);
        ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
        return MA_FALSE;
    }

    if (check_checksum)
    {
        if (checksum(ad) != ad->checksum)
        {
            (void)sprintf(ma_ebuf,
                "invalid checksum for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_guards)
    {
        if (!guard_check(ad))
        {
            (void)sprintf(ma_ebuf,
                "invalid guard(s) for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_heap)
    {
        if (!list_member(ad, ma_hused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stack)
    {
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stacktop)
    {
        /* is it in the stack? */
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }

        /* is it on top of the stack? */
        if ((Pointer)ad != ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not top of stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_heapandstack)
    {
        if ((!list_member(ad, ma_hused)) && (!list_member(ad, ma_sused)))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap or stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    /* ad is valid */
    *adout = ad;
    return MA_TRUE;
}